

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  undefined1 auVar22 [64];
  vint4 bi;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  Intersectors *local_10a8;
  size_t local_10a0;
  Precalculations *local_1098;
  RayHitK<8> *local_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined4 local_1008;
  undefined4 uStack_1004;
  undefined4 uStack_1000;
  undefined4 uStack_ffc;
  undefined4 local_ff8;
  undefined4 uStack_ff4;
  undefined4 uStack_ff0;
  undefined4 uStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1098 = pre;
  local_10a8 = This;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1028._4_4_ = uVar1;
  local_1028._0_4_ = uVar1;
  local_1028._8_4_ = uVar1;
  local_1028._12_4_ = uVar1;
  auVar61 = ZEXT1664(local_1028);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10d8._4_4_ = uVar1;
  local_10d8._0_4_ = uVar1;
  local_10d8._8_4_ = uVar1;
  local_10d8._12_4_ = uVar1;
  auVar62 = ZEXT1664(local_10d8);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  local_ff8 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_ff4 = local_ff8;
  uStack_ff0 = local_ff8;
  uStack_fec = local_ff8;
  local_1008 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  uStack_1004 = local_1008;
  uStack_1000 = local_1008;
  uStack_ffc = local_1008;
  local_1018 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  local_1068 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1078 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1088 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1038 = local_1068 * 0.99999964;
  local_1048 = local_1078 * 0.99999964;
  local_1058 = local_1088 * 0.99999964;
  local_1068 = local_1068 * 1.0000004;
  local_1078 = local_1078 * 1.0000004;
  local_1088 = local_1088 * 1.0000004;
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar2 = (tray->tnear).field_0.i[k];
  local_10b8._4_4_ = iVar2;
  local_10b8._0_4_ = iVar2;
  local_10b8._8_4_ = iVar2;
  local_10b8._12_4_ = iVar2;
  auVar50 = ZEXT1664(local_10b8);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar22 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  fStack_1084 = local_1088;
  fStack_1080 = local_1088;
  fStack_107c = local_1088;
  local_1090 = ray;
  local_10a0 = k;
  pauVar20 = (undefined1 (*) [16])local_f68;
  fVar52 = local_1038;
  fVar53 = local_1038;
  fVar54 = local_1038;
  fVar55 = local_1038;
  fVar56 = local_1048;
  fVar58 = local_1048;
  fVar59 = local_1048;
  fVar60 = local_1048;
  fVar63 = local_1058;
  fVar64 = local_1058;
  fVar65 = local_1058;
  fVar66 = local_1058;
  fVar67 = local_1068;
  fVar68 = local_1068;
  fVar69 = local_1068;
  fVar70 = local_1068;
  fVar71 = local_1078;
  fVar72 = local_1078;
  fVar73 = local_1078;
  fVar74 = local_1078;
  fVar75 = local_1088;
  fVar76 = local_1088;
  fVar77 = local_1088;
  fVar78 = local_1088;
LAB_01612e39:
  do {
    do {
      if (pauVar20 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar12 = pauVar20 + -1;
      pauVar20 = pauVar20 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar12 + 8));
    uVar14 = *(ulong *)*pauVar20;
    while ((uVar14 & 8) == 0) {
      fVar3 = *(float *)(ray + k * 4 + 0xe0);
      uVar13 = (uint)uVar14 & 7;
      uVar19 = uVar14 & 0xfffffffffffffff0;
      if (uVar13 == 3) {
        local_fe8 = *(undefined1 (*) [16])(uVar19 + 0x20);
        local_fd8 = *(undefined1 (*) [16])(uVar19 + 0x30);
        auVar24 = *(undefined1 (*) [16])(uVar19 + 0x80);
        auVar6 = *(undefined1 (*) [16])(uVar19 + 0x90);
        fStack_f9c = 1.0 - fVar3;
        auVar25._4_4_ = fStack_f9c;
        auVar25._0_4_ = fStack_f9c;
        auVar25._8_4_ = fStack_f9c;
        auVar25._12_4_ = fStack_f9c;
        auVar57._0_4_ = fVar3 * *(float *)(uVar19 + 0xe0);
        auVar57._4_4_ = fVar3 * *(float *)(uVar19 + 0xe4);
        auVar57._8_4_ = fVar3 * *(float *)(uVar19 + 0xe8);
        auVar57._12_4_ = fVar3 * *(float *)(uVar19 + 0xec);
        auVar31._0_4_ = fVar3 * *(float *)(uVar19 + 0xf0);
        auVar31._4_4_ = fVar3 * *(float *)(uVar19 + 0xf4);
        auVar31._8_4_ = fVar3 * *(float *)(uVar19 + 0xf8);
        auVar31._12_4_ = fVar3 * *(float *)(uVar19 + 0xfc);
        auVar46._0_4_ = fVar3 * *(float *)(uVar19 + 0x100);
        auVar46._4_4_ = fVar3 * *(float *)(uVar19 + 0x104);
        auVar46._8_4_ = fVar3 * *(float *)(uVar19 + 0x108);
        auVar46._12_4_ = fVar3 * *(float *)(uVar19 + 0x10c);
        auVar26 = ZEXT816(0) << 0x40;
        local_f98 = vfmadd231ps_fma(auVar57,auVar25,auVar26);
        local_10c8 = vfmadd231ps_fma(auVar31,auVar25,auVar26);
        local_f88 = vfmadd231ps_fma(auVar46,auVar25,auVar26);
        local_fc8 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x110);
        fStack_fc4 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x114);
        fStack_fc0 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x118);
        fStack_fbc = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x11c);
        local_fb8 = fVar3 * *(float *)(uVar19 + 0x120) + fStack_f9c;
        fStack_fb4 = fVar3 * *(float *)(uVar19 + 0x124) + fStack_f9c;
        fStack_fb0 = fVar3 * *(float *)(uVar19 + 0x128) + fStack_f9c;
        fStack_fac = fVar3 * *(float *)(uVar19 + 300) + fStack_f9c;
        local_fa8 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x130);
        fStack_fa4 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x134);
        fStack_fa0 = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x138);
        fStack_f9c = fStack_f9c + fVar3 * *(float *)(uVar19 + 0x13c);
        auVar26._0_4_ = local_1018 * auVar24._0_4_;
        auVar26._4_4_ = fStack_1014 * auVar24._4_4_;
        auVar26._8_4_ = fStack_1010 * auVar24._8_4_;
        auVar26._12_4_ = fStack_100c * auVar24._12_4_;
        auVar43._0_4_ = local_1018 * auVar6._0_4_;
        auVar43._4_4_ = fStack_1014 * auVar6._4_4_;
        auVar43._8_4_ = fStack_1010 * auVar6._8_4_;
        auVar43._12_4_ = fStack_100c * auVar6._12_4_;
        auVar10._4_4_ = uStack_1004;
        auVar10._0_4_ = local_1008;
        auVar10._8_4_ = uStack_1000;
        auVar10._12_4_ = uStack_ffc;
        auVar25 = vfmadd231ps_fma(auVar26,auVar10,*(undefined1 (*) [16])(uVar19 + 0x50));
        auVar26 = vfmadd231ps_fma(auVar43,auVar10,*(undefined1 (*) [16])(uVar19 + 0x60));
        auVar9._4_4_ = uStack_ff4;
        auVar9._0_4_ = local_ff8;
        auVar9._8_4_ = uStack_ff0;
        auVar9._12_4_ = uStack_fec;
        auVar7 = vfmadd231ps_fma(auVar25,auVar9,local_fe8);
        auVar26 = vfmadd231ps_fma(auVar26,auVar9,local_fd8);
        auVar32._8_4_ = 0x7fffffff;
        auVar32._0_8_ = 0x7fffffff7fffffff;
        auVar32._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx(auVar7,auVar32);
        auVar37._8_4_ = 0x219392ef;
        auVar37._0_8_ = 0x219392ef219392ef;
        auVar37._12_4_ = 0x219392ef;
        auVar25 = vcmpps_avx(auVar25,auVar37,1);
        auVar7 = vblendvps_avx(auVar7,auVar37,auVar25);
        auVar25 = vandps_avx(auVar26,auVar32);
        auVar25 = vcmpps_avx(auVar25,auVar37,1);
        auVar31 = vblendvps_avx(auVar26,auVar37,auVar25);
        auVar25 = *(undefined1 (*) [16])(uVar19 + 0xa0);
        auVar27._0_4_ = local_1018 * auVar25._0_4_;
        auVar27._4_4_ = fStack_1014 * auVar25._4_4_;
        auVar27._8_4_ = fStack_1010 * auVar25._8_4_;
        auVar27._12_4_ = fStack_100c * auVar25._12_4_;
        auVar26 = vfmadd231ps_fma(auVar27,auVar10,*(undefined1 (*) [16])(uVar19 + 0x70));
        auVar10 = vfmadd231ps_fma(auVar26,auVar9,*(undefined1 (*) [16])(uVar19 + 0x40));
        auVar26 = vandps_avx(auVar10,auVar32);
        auVar26 = vcmpps_avx(auVar26,auVar37,1);
        auVar26 = vblendvps_avx(auVar10,auVar37,auVar26);
        auVar10 = vrcpps_avx(auVar7);
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar7 = vfnmadd213ps_fma(auVar7,auVar10,auVar38);
        auVar10 = vfmadd132ps_fma(auVar7,auVar10,auVar10);
        auVar7 = vrcpps_avx(auVar31);
        auVar31 = vfnmadd213ps_fma(auVar31,auVar7,auVar38);
        auVar9 = vfmadd132ps_fma(auVar31,auVar7,auVar7);
        auVar7 = vrcpps_avx(auVar26);
        auVar26 = vfnmadd213ps_fma(auVar26,auVar7,auVar38);
        auVar24 = vfmadd213ps_fma(auVar24,auVar51,*(undefined1 (*) [16])(uVar19 + 0xb0));
        auVar27 = vfmadd132ps_fma(auVar26,auVar7,auVar7);
        auVar26 = vfmadd231ps_fma(auVar24,*(undefined1 (*) [16])(uVar19 + 0x50),local_10d8);
        auVar61 = ZEXT1664(local_1028);
        auVar24 = vfmadd213ps_fma(auVar6,auVar51,*(undefined1 (*) [16])(uVar19 + 0xc0));
        auVar6 = vfmadd231ps_fma(auVar24,*(undefined1 (*) [16])(uVar19 + 0x60),local_10d8);
        auVar62 = ZEXT1664(local_10d8);
        auVar24 = vfmadd213ps_fma(auVar25,auVar51,*(undefined1 (*) [16])(uVar19 + 0xd0));
        auVar24 = vfmadd231ps_fma(auVar24,local_10d8,*(undefined1 (*) [16])(uVar19 + 0x70));
        auVar25 = vfmadd231ps_fma(auVar26,local_1028,local_fe8);
        auVar26 = vfmadd231ps_fma(auVar6,local_1028,local_fd8);
        auVar31 = vfmadd231ps_fma(auVar24,local_1028,*(undefined1 (*) [16])(uVar19 + 0x40));
        auVar24 = vsubps_avx(local_f98,auVar25);
        auVar6._4_4_ = fStack_fc4;
        auVar6._0_4_ = local_fc8;
        auVar6._8_4_ = fStack_fc0;
        auVar6._12_4_ = fStack_fbc;
        auVar6 = vsubps_avx(auVar6,auVar25);
        auVar25 = vsubps_avx(local_10c8,auVar26);
        auVar7._4_4_ = fStack_fb4;
        auVar7._0_4_ = local_fb8;
        auVar7._8_4_ = fStack_fb0;
        auVar7._12_4_ = fStack_fac;
        auVar26 = vsubps_avx(auVar7,auVar26);
        auVar7 = vsubps_avx(local_f88,auVar31);
        auVar11._4_4_ = fStack_fa4;
        auVar11._0_4_ = local_fa8;
        auVar11._8_4_ = fStack_fa0;
        auVar11._12_4_ = fStack_f9c;
        auVar31 = vsubps_avx(auVar11,auVar31);
        auVar33._0_4_ = auVar10._0_4_ * auVar24._0_4_;
        auVar33._4_4_ = auVar10._4_4_ * auVar24._4_4_;
        auVar33._8_4_ = auVar10._8_4_ * auVar24._8_4_;
        auVar33._12_4_ = auVar10._12_4_ * auVar24._12_4_;
        auVar39._0_4_ = auVar10._0_4_ * auVar6._0_4_;
        auVar39._4_4_ = auVar10._4_4_ * auVar6._4_4_;
        auVar39._8_4_ = auVar10._8_4_ * auVar6._8_4_;
        auVar39._12_4_ = auVar10._12_4_ * auVar6._12_4_;
        auVar44._0_4_ = auVar9._0_4_ * auVar25._0_4_;
        auVar44._4_4_ = auVar9._4_4_ * auVar25._4_4_;
        auVar44._8_4_ = auVar9._8_4_ * auVar25._8_4_;
        auVar44._12_4_ = auVar9._12_4_ * auVar25._12_4_;
        auVar49._0_4_ = auVar7._0_4_ * auVar27._0_4_;
        auVar49._4_4_ = auVar7._4_4_ * auVar27._4_4_;
        auVar49._8_4_ = auVar7._8_4_ * auVar27._8_4_;
        auVar49._12_4_ = auVar7._12_4_ * auVar27._12_4_;
        auVar47._0_4_ = auVar9._0_4_ * auVar26._0_4_;
        auVar47._4_4_ = auVar9._4_4_ * auVar26._4_4_;
        auVar47._8_4_ = auVar9._8_4_ * auVar26._8_4_;
        auVar47._12_4_ = auVar9._12_4_ * auVar26._12_4_;
        auVar28._0_4_ = auVar31._0_4_ * auVar27._0_4_;
        auVar28._4_4_ = auVar31._4_4_ * auVar27._4_4_;
        auVar28._8_4_ = auVar31._8_4_ * auVar27._8_4_;
        auVar28._12_4_ = auVar31._12_4_ * auVar27._12_4_;
        auVar24 = vpminsd_avx(auVar44,auVar47);
        auVar6 = vpminsd_avx(auVar49,auVar28);
        auVar24 = vmaxps_avx(auVar24,auVar6);
        auVar7 = vpminsd_avx(auVar33,auVar39);
        auVar26 = vpmaxsd_avx(auVar33,auVar39);
        auVar6 = vpmaxsd_avx(auVar44,auVar47);
        auVar25 = vpmaxsd_avx(auVar49,auVar28);
        auVar50 = ZEXT1664(local_10b8);
        auVar25 = vminps_avx(auVar6,auVar25);
        auVar6 = vmaxps_avx(local_10b8,auVar7);
        auVar24 = vmaxps_avx(auVar6,auVar24);
        auVar6 = vminps_avx(auVar22._0_16_,auVar26);
        auVar6 = vminps_avx(auVar6,auVar25);
        local_10e8._0_4_ = auVar24._0_4_ * 0.99999964;
        local_10e8._4_4_ = auVar24._4_4_ * 0.99999964;
        local_10e8._8_4_ = auVar24._8_4_ * 0.99999964;
        local_10e8._12_4_ = auVar24._12_4_ * 0.99999964;
        auVar24._0_4_ = auVar6._0_4_ * 1.0000004;
        auVar24._4_4_ = auVar6._4_4_ * 1.0000004;
        auVar24._8_4_ = auVar6._8_4_ * 1.0000004;
        auVar24._12_4_ = auVar6._12_4_ * 1.0000004;
        auVar24 = vcmpps_avx(local_10e8,auVar24,2);
        uVar13 = vmovmskps_avx(auVar24);
        fVar52 = local_1038;
        fVar53 = fStack_1034;
        fVar54 = fStack_1030;
        fVar55 = fStack_102c;
        fVar56 = local_1048;
        fVar58 = fStack_1044;
        fVar59 = fStack_1040;
        fVar60 = fStack_103c;
        fVar63 = local_1058;
        fVar64 = fStack_1054;
        fVar65 = fStack_1050;
        fVar66 = fStack_104c;
        fVar67 = local_1068;
        fVar68 = fStack_1064;
        fVar69 = fStack_1060;
        fVar70 = fStack_105c;
        fVar71 = local_1078;
        fVar72 = fStack_1074;
        fVar73 = fStack_1070;
        fVar74 = fStack_106c;
        fVar75 = local_1088;
        fVar76 = fStack_1084;
        fVar77 = fStack_1080;
        fVar78 = fStack_107c;
      }
      else {
        auVar23._4_4_ = fVar3;
        auVar23._0_4_ = fVar3;
        auVar23._8_4_ = fVar3;
        auVar23._12_4_ = fVar3;
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar17),auVar23,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar17));
        auVar24 = vsubps_avx(auVar24,auVar61._0_16_);
        auVar30._0_4_ = fVar52 * auVar24._0_4_;
        auVar30._4_4_ = fVar53 * auVar24._4_4_;
        auVar30._8_4_ = fVar54 * auVar24._8_4_;
        auVar30._12_4_ = fVar55 * auVar24._12_4_;
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar21),auVar23,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar21));
        auVar24 = vsubps_avx(auVar24,auVar62._0_16_);
        auVar35._0_4_ = fVar56 * auVar24._0_4_;
        auVar35._4_4_ = fVar58 * auVar24._4_4_;
        auVar35._8_4_ = fVar59 * auVar24._8_4_;
        auVar35._12_4_ = fVar60 * auVar24._12_4_;
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar18),auVar23,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar18));
        auVar24 = vsubps_avx(auVar24,auVar51);
        auVar41._0_4_ = fVar63 * auVar24._0_4_;
        auVar41._4_4_ = fVar64 * auVar24._4_4_;
        auVar41._8_4_ = fVar65 * auVar24._8_4_;
        auVar41._12_4_ = fVar66 * auVar24._12_4_;
        auVar24 = vmaxps_avx(auVar35,auVar41);
        auVar6 = vmaxps_avx(auVar50._0_16_,auVar30);
        local_10e8 = vmaxps_avx(auVar6,auVar24);
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar17 ^ 0x10)),auVar23,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar17 ^ 0x10)));
        auVar24 = vsubps_avx(auVar24,auVar61._0_16_);
        auVar6 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar21 ^ 0x10)),auVar23,
                                 *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar21 ^ 0x10)));
        auVar36._0_4_ = fVar67 * auVar24._0_4_;
        auVar36._4_4_ = fVar68 * auVar24._4_4_;
        auVar36._8_4_ = fVar69 * auVar24._8_4_;
        auVar36._12_4_ = fVar70 * auVar24._12_4_;
        auVar24 = vsubps_avx(auVar6,auVar62._0_16_);
        auVar42._0_4_ = fVar71 * auVar24._0_4_;
        auVar42._4_4_ = fVar72 * auVar24._4_4_;
        auVar42._8_4_ = fVar73 * auVar24._8_4_;
        auVar42._12_4_ = fVar74 * auVar24._12_4_;
        auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar18 ^ 0x10)),auVar23,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar18 ^ 0x10)));
        auVar24 = vsubps_avx(auVar24,auVar51);
        auVar45._0_4_ = fVar75 * auVar24._0_4_;
        auVar45._4_4_ = fVar76 * auVar24._4_4_;
        auVar45._8_4_ = fVar77 * auVar24._8_4_;
        auVar45._12_4_ = fVar78 * auVar24._12_4_;
        auVar24 = vminps_avx(auVar42,auVar45);
        auVar6 = vminps_avx(auVar22._0_16_,auVar36);
        auVar24 = vminps_avx(auVar6,auVar24);
        if (uVar13 == 6) {
          auVar6 = vcmpps_avx(local_10e8,auVar24,2);
          auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar19 + 0xe0),auVar23,2);
          auVar25 = vcmpps_avx(auVar23,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
          auVar24 = vandps_avx(auVar24,auVar25);
          auVar24 = vandps_avx(auVar24,auVar6);
        }
        else {
          auVar24 = vcmpps_avx(local_10e8,auVar24,2);
        }
        auVar24 = vpslld_avx(auVar24,0x1f);
        uVar13 = vmovmskps_avx(auVar24);
      }
      uVar14 = (ulong)uVar13;
      if (uVar14 == 0) goto LAB_01612e39;
      lVar8 = 0;
      for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
        lVar8 = lVar8 + 1;
      }
      uVar13 = uVar13 - 1 & uVar13;
      uVar15 = (ulong)uVar13;
      uVar14 = *(ulong *)(uVar19 + lVar8 * 8);
      if (uVar13 != 0) {
        uVar4 = *(uint *)(local_10e8 + lVar8 * 4);
        lVar8 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar8 = lVar8 + 1;
        }
        uVar13 = uVar13 - 1 & uVar13;
        uVar16 = (ulong)uVar13;
        uVar15 = *(ulong *)(uVar19 + lVar8 * 8);
        uVar5 = *(uint *)(local_10e8 + lVar8 * 4);
        if (uVar13 == 0) {
          if (uVar4 < uVar5) {
            *(ulong *)*pauVar20 = uVar15;
            *(uint *)(*pauVar20 + 8) = uVar5;
            pauVar20 = pauVar20 + 1;
          }
          else {
            *(ulong *)*pauVar20 = uVar14;
            *(uint *)(*pauVar20 + 8) = uVar4;
            uVar14 = uVar15;
            pauVar20 = pauVar20 + 1;
          }
        }
        else {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar14;
          auVar24 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar4));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar15;
          auVar6 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar5));
          lVar8 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar14 = (ulong)uVar13;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(uVar19 + lVar8 * 8);
          auVar26 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_10e8 + lVar8 * 4)));
          auVar25 = vpcmpgtd_avx(auVar6,auVar24);
          if (uVar13 == 0) {
            auVar7 = vpshufd_avx(auVar25,0xaa);
            auVar25 = vblendvps_avx(auVar6,auVar24,auVar7);
            auVar24 = vblendvps_avx(auVar24,auVar6,auVar7);
            auVar6 = vpcmpgtd_avx(auVar26,auVar25);
            auVar7 = vpshufd_avx(auVar6,0xaa);
            auVar6 = vblendvps_avx(auVar26,auVar25,auVar7);
            auVar25 = vblendvps_avx(auVar25,auVar26,auVar7);
            auVar26 = vpcmpgtd_avx(auVar25,auVar24);
            auVar7 = vpshufd_avx(auVar26,0xaa);
            auVar26 = vblendvps_avx(auVar25,auVar24,auVar7);
            auVar24 = vblendvps_avx(auVar24,auVar25,auVar7);
            *pauVar20 = auVar24;
            pauVar20[1] = auVar26;
            uVar14 = auVar6._0_8_;
            pauVar20 = pauVar20 + 2;
          }
          else {
            lVar8 = 0;
            for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)(uVar19 + lVar8 * 8);
            auVar31 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_10e8 + lVar8 * 4)));
            auVar7 = vpshufd_avx(auVar25,0xaa);
            auVar25 = vblendvps_avx(auVar6,auVar24,auVar7);
            auVar24 = vblendvps_avx(auVar24,auVar6,auVar7);
            auVar6 = vpcmpgtd_avx(auVar31,auVar26);
            auVar7 = vpshufd_avx(auVar6,0xaa);
            auVar6 = vblendvps_avx(auVar31,auVar26,auVar7);
            auVar26 = vblendvps_avx(auVar26,auVar31,auVar7);
            auVar7 = vpcmpgtd_avx(auVar26,auVar24);
            auVar31 = vpshufd_avx(auVar7,0xaa);
            auVar7 = vblendvps_avx(auVar26,auVar24,auVar31);
            auVar24 = vblendvps_avx(auVar24,auVar26,auVar31);
            auVar26 = vpcmpgtd_avx(auVar6,auVar25);
            auVar31 = vpshufd_avx(auVar26,0xaa);
            auVar26 = vblendvps_avx(auVar6,auVar25,auVar31);
            auVar6 = vblendvps_avx(auVar25,auVar6,auVar31);
            auVar25 = vpcmpgtd_avx(auVar7,auVar6);
            auVar31 = vpshufd_avx(auVar25,0xaa);
            auVar25 = vblendvps_avx(auVar7,auVar6,auVar31);
            auVar6 = vblendvps_avx(auVar6,auVar7,auVar31);
            *pauVar20 = auVar24;
            pauVar20[1] = auVar6;
            pauVar20[2] = auVar25;
            auVar50 = ZEXT1664(local_10b8);
            uVar14 = auVar26._0_8_;
            pauVar20 = pauVar20 + 3;
          }
        }
      }
    }
    local_10c8._0_8_ = pauVar20;
    (**(code **)((long)local_10a8->leafIntersector +
                (ulong)*(byte *)(uVar14 & 0xfffffffffffffff0) * 0x40 + 0x20))
              (local_1098,ray,k,context);
    auVar50 = ZEXT1664(local_10b8);
    auVar62 = ZEXT1664(local_10d8);
    auVar61 = ZEXT1664(local_1028);
    uVar1 = *(undefined4 *)(local_1090 + local_10a0 * 4 + 0x100);
    auVar22 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    ray = local_1090;
    k = local_10a0;
    pauVar20 = (undefined1 (*) [16])local_10c8._0_8_;
    fVar52 = local_1038;
    fVar53 = fStack_1034;
    fVar54 = fStack_1030;
    fVar55 = fStack_102c;
    fVar56 = local_1048;
    fVar58 = fStack_1044;
    fVar59 = fStack_1040;
    fVar60 = fStack_103c;
    fVar63 = local_1058;
    fVar64 = fStack_1054;
    fVar65 = fStack_1050;
    fVar66 = fStack_104c;
    fVar67 = local_1068;
    fVar68 = fStack_1064;
    fVar69 = fStack_1060;
    fVar70 = fStack_105c;
    fVar71 = local_1078;
    fVar72 = fStack_1074;
    fVar73 = fStack_1070;
    fVar74 = fStack_106c;
    fVar75 = local_1088;
    fVar76 = fStack_1084;
    fVar77 = fStack_1080;
    fVar78 = fStack_107c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }